

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall
wasm::RemoveNonJSOpsPass::addNeededFunctions
          (RemoveNonJSOpsPass *this,Module *m,Name name,
          set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *needed)

{
  Call *pCVar1;
  Name name_00;
  bool bVar2;
  Function *pFVar3;
  reference ppCVar4;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar5;
  Function *called;
  Call *call;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range2;
  FindAll<wasm::Call> calls;
  Function *function;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *needed_local;
  Module *m_local;
  RemoveNonJSOpsPass *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  pVar5 = std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
          emplace<wasm::Name&>
                    ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)needed,
                     (Name *)&this_local);
  if (((pVar5.second ^ 0xffU) & 1) == 0) {
    calls.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    pFVar3 = Module::getFunction(m,name_00);
    FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)&__range2,pFVar3->body);
    __end2 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                       ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&__range2);
    call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                             ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                       *)&call), bVar2) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                ::operator*(&__end2);
      pCVar1 = *ppCVar4;
      pFVar3 = Module::getFunction(m,(Name)(pCVar1->target).super_IString.str);
      bVar2 = Importable::imported(&pFVar3->super_Importable);
      if (!bVar2) {
        addNeededFunctions(this,m,(Name)(pCVar1->target).super_IString.str,needed);
      }
      __gnu_cxx::
      __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>::
      operator++(&__end2);
    }
    FindAll<wasm::Call>::~FindAll((FindAll<wasm::Call> *)&__range2);
  }
  return;
}

Assistant:

void addNeededFunctions(Module& m, Name name, std::set<Name>& needed) {
    if (!needed.emplace(name).second) {
      return;
    }

    auto function = m.getFunction(name);
    FindAll<Call> calls(function->body);
    for (auto* call : calls.list) {
      auto* called = m.getFunction(call->target);
      if (!called->imported()) {
        this->addNeededFunctions(m, call->target, needed);
      }
    }
  }